

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::VarintTest_TestWriteUnsigned64_Test::~VarintTest_TestWriteUnsigned64_Test
          (VarintTest_TestWriteUnsigned64_Test *this)

{
  VarintTest_TestWriteUnsigned64_Test *this_local;
  
  ~VarintTest_TestWriteUnsigned64_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VarintTest, TestWriteUnsigned64)
{
    ASSERT_EQ("00", HexEncoderDecoder::WriteU64ToHexString(0, 1));
    ASSERT_EQ("01", HexEncoderDecoder::WriteU64ToHexString(1, 1));
    ASSERT_EQ("02", HexEncoderDecoder::WriteU64ToHexString(2, 1));
    ASSERT_EQ("11", HexEncoderDecoder::WriteU64ToHexString(17, 1));
    ASSERT_EQ("7f", HexEncoderDecoder::WriteU64ToHexString(127, 1));

    ASSERT_EQ("8001", HexEncoderDecoder::WriteU64ToHexString(128, 2));
    ASSERT_EQ("a274", HexEncoderDecoder::WriteU64ToHexString(14882, 2));
    ASSERT_EQ("a08d06", HexEncoderDecoder::WriteU64ToHexString(100000, 3));
    ASSERT_EQ("ffffffffffffffff",
              HexEncoderDecoder::WriteU64ToHexString(9223372036854775807L, 8)); // Endianness might affect his test!!
}